

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<FunctionDef>::moveAppend
          (QGenericArrayOps<FunctionDef> *this,FunctionDef *b,FunctionDef *e)

{
  qsizetype *pqVar1;
  FunctionDef *pFVar2;
  
  if (b != e) {
    pFVar2 = (this->super_QArrayDataPointer<FunctionDef>).ptr;
    for (; b < e; b = b + 1) {
      FunctionDef::FunctionDef(pFVar2 + (this->super_QArrayDataPointer<FunctionDef>).size,b);
      pqVar1 = &(this->super_QArrayDataPointer<FunctionDef>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }